

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<int>::readBuffer
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,VertexBufferObject<int> *this)

{
  ulong __n;
  void *__src;
  reference __dest;
  socklen_t in_ECX;
  sockaddr *__addr;
  int __fd;
  GLvoid *results;
  allocator<int> local_1a;
  undefined1 local_19;
  VertexBufferObject<int> *local_18;
  VertexBufferObject<int> *this_local;
  vector<int,_std::allocator<int>_> *buffer_data;
  
  local_19 = 0;
  __n = (ulong)(long)this->m_size >> 2;
  local_18 = this;
  this_local = (VertexBufferObject<int> *)__return_storage_ptr__;
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_1a);
  __fd = (int)__n;
  std::allocator<int>::~allocator(&local_1a);
  bind(this,__fd,__addr,in_ECX);
  __src = (*this->m_gl->mapBuffer)(this->m_target,35000);
  if (__src != (void *)0x0) {
    __dest = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
    memcpy(__dest,__src,(long)this->m_size);
  }
  (*this->m_gl->unmapBuffer)(this->m_target);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gl3cts::ClipDistance::Utility::VertexBufferObject<T>::readBuffer()
{
	std::vector<T> buffer_data(m_size / sizeof(T));

	bind();

	glw::GLvoid* results = m_gl.mapBuffer(m_target, GL_READ_ONLY);

	if (results)
	{
		memcpy(&buffer_data[0], results, m_size);
	}

	m_gl.unmapBuffer(m_target);

	return buffer_data;
}